

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QGenericArrayOps<EnumNameValue>::copyAppend
          (QGenericArrayOps<EnumNameValue> *this,EnumNameValue *b,EnumNameValue *e)

{
  qsizetype *pqVar1;
  EnumNameValue *pEVar2;
  long lVar3;
  Data *pDVar4;
  
  if ((b != e) && (b < e)) {
    pEVar2 = (this->super_QArrayDataPointer<EnumNameValue>).ptr;
    do {
      lVar3 = (this->super_QArrayDataPointer<EnumNameValue>).size;
      pDVar4 = (b->name).d.d;
      pEVar2[lVar3].name.d.d = pDVar4;
      pEVar2[lVar3].name.d.ptr = (b->name).d.ptr;
      pEVar2[lVar3].name.d.size = (b->name).d.size;
      if (pDVar4 != (Data *)0x0) {
        LOCK();
        (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int> =
             (__atomic_base<int>)
             ((__int_type)(pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1);
        UNLOCK();
      }
      pDVar4 = (b->valueStr).d.d;
      pEVar2[lVar3].valueStr.d.d = pDVar4;
      pEVar2[lVar3].valueStr.d.ptr = (b->valueStr).d.ptr;
      pEVar2[lVar3].valueStr.d.size = (b->valueStr).d.size;
      if (pDVar4 != (Data *)0x0) {
        LOCK();
        (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pEVar2[lVar3].value = b->value;
      b = b + 1;
      pqVar1 = &(this->super_QArrayDataPointer<EnumNameValue>).size;
      *pqVar1 = *pqVar1 + 1;
    } while (b < e);
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e) // short-cut and handling the case b and e == nullptr
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(*b);
            ++b;
            ++this->size;
        }
    }